

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,LogicalType *param,LogicalType *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  LogicalType local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  LogicalType local_c0;
  LogicalType local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [56];
  
  LogicalType::LogicalType(&local_a0,(LogicalType *)values);
  ExceptionFormatValue::CreateFormatValue<duckdb::LogicalType>
            ((ExceptionFormatValue *)local_68,&local_a0);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)local_68);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x18));
  LogicalType::~LogicalType(&local_a0);
  LogicalType::LogicalType(&local_f8,param);
  ::std::__cxx11::string::string((string *)&local_c0,(string *)params);
  ::std::__cxx11::string::string((string *)&local_e0,(string *)params_1);
  ::std::__cxx11::string::string((string *)&local_88,(string *)params_2);
  ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &local_f8,&local_c0,&local_e0,&local_88,in_stack_ffffffffffffff00);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  LogicalType::~LogicalType(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}